

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

void av1_cnn_convolve_no_maxpool_padding_valid_c
               (float **input,int in_width,int in_height,int in_stride,
               CNN_LAYER_CONFIG *layer_config,float **output,int out_stride,int start_idx,int cstep,
               int channel_step)

{
  int iVar1;
  int jj;
  int ii;
  int off;
  int k;
  float sum;
  int upper_jj_index;
  int out_index;
  int w;
  int upper_ii_index;
  int out_h;
  int u;
  int h;
  int i;
  float **output_local;
  CNN_LAYER_CONFIG *layer_config_local;
  int in_stride_local;
  int in_height_local;
  int in_width_local;
  float **input_local;
  
  for (i = start_idx; i < layer_config->out_channels; i = channel_step + i) {
    u = 0;
    for (h = 0; h < (in_height - layer_config->filter_height) + 1; h = layer_config->skip_height + h
        ) {
      out_index = u * out_stride;
      iVar1 = layer_config->filter_height;
      for (w = 0; w < (in_width - layer_config->filter_width) + 1; w = layer_config->skip_width + w)
      {
        sum = layer_config->bias[i];
        for (k = 0; k < layer_config->in_channels; k = k + 1) {
          off = k * layer_config->out_channels + i;
          for (ii = h; ii < iVar1 + h; ii = ii + 1) {
            for (jj = w; jj < layer_config->filter_width + w; jj = jj + 1) {
              sum = layer_config->weights[off] * input[k][ii * in_stride + jj] + sum;
              off = cstep + off;
            }
          }
        }
        output[i][out_index] = sum;
        out_index = out_index + 1;
      }
      u = u + 1;
    }
  }
  return;
}

Assistant:

void av1_cnn_convolve_no_maxpool_padding_valid_c(
    const float **input, int in_width, int in_height, int in_stride,
    const CNN_LAYER_CONFIG *layer_config, float **output, int out_stride,
    int start_idx, int cstep, int channel_step) {
  assert((layer_config->skip_height == 1 && layer_config->skip_width == 1) ||
         !layer_config->maxpool);
  assert(layer_config->filter_height > 1 || layer_config->filter_width > 1);
  assert(layer_config->pad == PADDING_VALID);
  for (int i = start_idx; i < layer_config->out_channels; i += channel_step) {
    for (int h = 0, u = 0; h < in_height - layer_config->filter_height + 1;
         h += layer_config->skip_height, ++u) {
      const int out_h = u * out_stride;
      const int upper_ii_index = layer_config->filter_height + h;
      for (int w = 0, out_index = out_h;
           w < in_width - layer_config->filter_width + 1;
           w += layer_config->skip_width, ++out_index) {
        const int upper_jj_index = layer_config->filter_width + w;
        float sum = layer_config->bias[i];
        for (int k = 0; k < layer_config->in_channels; ++k) {
          int off = k * layer_config->out_channels + i;
          for (int ii = h; ii < upper_ii_index; ++ii) {
            for (int jj = w; jj < upper_jj_index; ++jj) {
              assert(ii >= 0 && ii < in_height && jj >= 0 && jj < in_width);
              sum += layer_config->weights[off] * input[k][ii * in_stride + jj];
              off += cstep;
            }
          }
        }
        output[i][out_index] = sum;
      }
    }
  }
}